

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFileReader.cpp
# Opt level: O2

void __thiscall
Assimp::STEP::LazyObject::LazyObject
          (LazyObject *this,DB *db,uint64_t id,uint64_t param_3,char *type,char *args)

{
  char cVar1;
  bool bVar2;
  uint64_t who;
  long lVar3;
  long lVar4;
  char *pcVar5;
  char *tmp;
  
  this->id = id;
  this->type = type;
  this->db = db;
  this->args = args;
  this->obj = (Object *)0x0;
  bVar2 = DB::KeepInverseIndicesForType(db,type);
  if (!bVar2) {
    return;
  }
  lVar4 = 0;
  do {
    cVar1 = *args;
    lVar3 = 1;
    pcVar5 = args;
    if ((cVar1 == '(') || (lVar3 = -1, cVar1 == ')')) {
      lVar4 = lVar4 + lVar3;
    }
    else {
      if (cVar1 == '\0') {
        return;
      }
      if ((cVar1 == '#' && 0 < lVar4) && (pcVar5 = args + 1, args[1] != '#')) {
        who = strtoul10_64(pcVar5,&tmp,(uint *)0x0);
        DB::MarkRef(db,who,id);
        pcVar5 = args;
      }
    }
    args = pcVar5 + 1;
  } while( true );
}

Assistant:

STEP::LazyObject::LazyObject(DB& db, uint64_t id,uint64_t /*line*/, const char* const type,const char* args)
: id(id)
, type(type)
, db(db)
, args(args)
, obj() {
    // find any external references and store them in the database.
    // this helps us emulate STEPs INVERSE fields.
    if (!db.KeepInverseIndicesForType(type)) {
        return;
    }

    // do a quick scan through the argument tuple and watch out for entity references
    const char *a( args );
    int64_t skip_depth( 0 );
    while ( *a ) {
        handleSkippedDepthFromToken(a, skip_depth);
        /*if (*a == '(') {
            ++skip_depth;
        } else if (*a == ')') {
            --skip_depth;
        }*/

		if (skip_depth >= 1 && *a=='#') {
			if (*(a + 1) != '#') {
				/*const char *tmp;
				const int64_t num = static_cast<int64_t>(strtoul10_64(a + 1, &tmp));
				db.MarkRef(num, id);*/
                db.MarkRef(getIdFromToken(a), id);
			} else {
				++a;
			}
        }
        ++a;
    }
}